

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

void __thiscall w3Module::read_exports(w3Module *this,uint8_t **cursor)

{
  w3Export *pwVar1;
  size_t sVar2;
  byte bVar3;
  uint32_t uVar4;
  PCH pcVar5;
  WasmString local_68;
  reference local_30;
  w3Export *a;
  size_t i;
  size_t size;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  size = (size_t)cursor;
  cursor_local = (uint8_t **)this;
  printf("reading section 7\n");
  uVar4 = read_varuint32(this,(uint8_t **)size);
  i = (size_t)uVar4;
  printf("reading exports7 count:%lX\n",i);
  std::vector<w3Export,_std::allocator<w3Export>_>::resize(&this->exports,i);
  for (a = (w3Export *)0x0; a < i; a = (w3Export *)((long)&(a->name).data + 1)) {
    local_30 = std::vector<w3Export,_std::allocator<w3Export>_>::operator[]
                         (&this->exports,(size_type)a);
    read_string(&local_68,this,(uint8_t **)size);
    WasmString::operator=(&local_30->name,&local_68);
    WasmString::~WasmString(&local_68);
    bVar3 = read_byte(this,(uint8_t **)size);
    local_30->tag = (uint)bVar3;
    uVar4 = read_varuint32(this,(uint8_t **)size);
    sVar2 = i;
    pwVar1 = a;
    (local_30->field_4).function = uVar4;
    local_30->is_main = (local_30->name).builtin == w3BuiltinString_main;
    local_30->is_start = (local_30->name).builtin == w3BuiltinString_start;
    pcVar5 = WasmString::c_str(&local_30->name);
    printf("read_export %lX:%lX %s tag:%X index:%X is_main:%X is_start:%X\n",pwVar1,sVar2,pcVar5,
           (ulong)local_30->tag,(ulong)(local_30->field_4).function,(uint)(local_30->is_main & 1),
           (uint)(local_30->is_start & 1));
    if ((local_30->is_start & 1U) == 0) {
      if ((local_30->is_main & 1U) != 0) {
        if (this->main != (w3Export *)0x0) {
          AssertFailed("!main");
        }
        this->main = local_30;
      }
    }
    else {
      if (this->start != (w3Export *)0x0) {
        AssertFailed("!start");
      }
      this->start = local_30;
    }
  }
  printf("read exports7 size:%lX\n",i);
  return;
}

Assistant:

void w3Module::read_exports (uint8_t** cursor)
{
    printf ("reading section 7\n");
    const size_t size = read_varuint32 (cursor);
    printf ("reading exports7 count:%" FORMAT_SIZE "X\n", size);
    exports.resize (size);
    for (size_t i = 0; i < size; ++i)
    {
        w3Export& a = exports [i];
        a.name = read_string (cursor);
        a.tag = (w3ExportTag)read_byte (cursor);
        a.function = read_varuint32 (cursor);
        a.is_main = a.name.builtin == w3BuiltinString_main;
        a.is_start = a.name.builtin == w3BuiltinString_start;
        printf ("read_export %" FORMAT_SIZE "X:%" FORMAT_SIZE "X %s tag:%X index:%X is_main:%X is_start:%X\n", i, size, a.name.c_str (), a.tag, a.function, a.is_main, a.is_start);

        if (a.is_start)
        {
            Assert (!start);
            start = &a;
        }
        else if (a.is_main)
        {
            Assert (!main);
            main = &a;
        }
    }
    printf ("read exports7 size:%" FORMAT_SIZE "X\n", size);
}